

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O2

optional<long_long> __thiscall
QNetworkHeadersPrivate::toInt(QNetworkHeadersPrivate *this,QByteArrayView value)

{
  _Storage<long_long,_true> _Var1;
  _Storage<long_long,_true> _Var2;
  undefined8 extraout_RDX;
  undefined8 uVar3;
  long in_FS_OFFSET;
  optional<long_long> oVar4;
  bool ok;
  QByteArrayView value_local;
  
  value_local.m_data = (storage_type *)value.m_size;
  _Var1 = (_Storage<long_long,_true>)((_Storage<long_long,_true> *)(in_FS_OFFSET + 0x28))->_M_value;
  value_local.m_size = (qsizetype)this;
  if (this == (QNetworkHeadersPrivate *)0x0) {
    uVar3 = 0;
    _Var2 = _Var1;
  }
  else {
    ok = true;
    _Var2._M_value = QByteArrayView::toLongLong(&value_local,&ok,10);
    uVar3 = CONCAT71((int7)((ulong)extraout_RDX >> 8),ok);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == _Var1._M_value) {
    oVar4.super__Optional_base<long_long,_true,_true>._M_payload.
    super__Optional_payload_base<long_long>._8_8_ = uVar3;
    oVar4.super__Optional_base<long_long,_true,_true>._M_payload.
    super__Optional_payload_base<long_long>._M_payload._M_value = _Var2._M_value;
    return (optional<long_long>)
           oVar4.super__Optional_base<long_long,_true,_true>._M_payload.
           super__Optional_payload_base<long_long>;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<qint64> QNetworkHeadersPrivate::toInt(QByteArrayView value)
{
    if (value.empty())
        return std::nullopt;

    bool ok;
    qint64 res = value.toLongLong(&ok);
    if (ok)
        return res;
    return std::nullopt;
}